

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_2071e::StrEqVerbose
          (anon_unknown_dwarf_2071e *this,string *a,string *b,string *text)

{
  int iVar1;
  
  if ((string *)b->_M_string_length == a) {
    if (a == (string *)0x0) {
      return true;
    }
    iVar1 = bcmp(this,(b->_M_dataplus)._M_p,(size_t)a);
    if (iVar1 == 0) {
      return true;
    }
  }
  printf("EXPECTED: %s\n",this);
  printf("ACTUAL: %s\n",(b->_M_dataplus)._M_p);
  printf("TEXT: %s\n",(text->_M_dataplus)._M_p);
  return false;
}

Assistant:

bool StrEqVerbose(const string& a, const string& b,
                         const string& text) {
  if (a != b) {
    printf("EXPECTED: %s\n", a.c_str());
    printf("ACTUAL: %s\n", b.c_str());
    printf("TEXT: %s\n", text.c_str());
    return false;
  }
  return true;
}